

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Operation<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state,string_t *x,string_t *y,
               AggregateBinaryInput *binary)

{
  string_t x_data;
  string_t new_value;
  string_t new_value_00;
  string_t y_data;
  AggregateBinaryInput *in_stack_00000008;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    x_data.value.pointer.ptr = (char *)*(undefined8 *)&y->value;
    x_data.value._0_8_ = (x->value).pointer.ptr;
    y_data.value.pointer.ptr = (char *)binary;
    y_data.value._0_8_ = (y->value).pointer.ptr;
    Execute<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
              ((ArgMinMaxBase<duckdb::GreaterThan,true> *)state,
               *(ArgMinMaxState<duckdb::string_t,_duckdb::string_t> **)&x->value,x_data,y_data,
               in_stack_00000008);
    return;
  }
  new_value.value.pointer.ptr = (char *)binary;
  new_value.value._0_8_ = (x->value).pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->arg,*(string_t **)&x->value,new_value);
  new_value_00.value.pointer.ptr = (char *)binary;
  new_value_00.value._0_8_ = (y->value).pointer.ptr;
  ArgMinMaxStateBase::AssignValue<duckdb::string_t>
            ((ArgMinMaxStateBase *)&state->value,*(string_t **)&y->value,new_value_00);
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}